

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O3

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *pvVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int _w;
  bool bVar11;
  bool bVar12;
  int _h;
  long lVar13;
  int _h_00;
  int iVar14;
  bool bVar15;
  bool bVar16;
  Mat local_98;
  int local_54;
  int local_50;
  int local_4c;
  Option *local_48;
  Mat *local_40;
  Mat *local_38;
  
  iVar9 = bottom_blob->dims;
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  _h_00 = bottom_blob->c;
  pvVar1 = (this->axes).data;
  if ((pvVar1 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    bVar15 = this->squeeze_w != 0 && _w == 1;
    bVar11 = this->squeeze_h != 0 && _h == 1;
    bVar12 = this->squeeze_c != 0 && _h_00 == 1;
  }
  else {
    lVar10 = (long)(this->axes).w;
    if (lVar10 < 1) {
      bVar15 = false;
      bVar11 = false;
      bVar12 = false;
    }
    else {
      bVar16 = _w == 1;
      lVar13 = 0;
      bVar11 = false;
      bVar15 = false;
      bVar6 = false;
      do {
        iVar14 = *(int *)((long)pvVar1 + lVar13 * 4);
        iVar14 = (iVar14 >> 0x1f & iVar9 + 1U) + iVar14;
        bVar3 = bVar15;
        bVar12 = bVar6;
        bVar5 = bVar11;
        if (iVar14 == 1) {
          bVar3 = bVar16;
          bVar12 = _h_00 == 1;
          bVar5 = _h == 1;
        }
        if (iVar9 != 2) {
          bVar5 = bVar11;
        }
        if (iVar9 != 1) {
          bVar3 = bVar15;
        }
        bVar4 = bVar3;
        bVar11 = bVar5;
        if (iVar14 == 2) {
          bVar4 = bVar16;
          bVar11 = _h == 1;
        }
        if (iVar9 != 2) {
          bVar4 = bVar3;
        }
        bVar15 = bVar4;
        if (iVar14 == 3) {
          bVar15 = bVar16;
        }
        if (iVar9 != 3) {
          bVar15 = bVar4;
          bVar11 = bVar5;
          bVar12 = bVar6;
        }
        lVar13 = lVar13 + 1;
        local_54 = _h_00;
        local_50 = _w;
        local_4c = _h;
        local_48 = opt;
        local_40 = bottom_blob;
        local_38 = top_blob;
        bVar6 = bVar12;
      } while (lVar10 != lVar13);
    }
  }
  if (top_blob != bottom_blob) {
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            local_54 = _h_00;
            local_50 = _w;
            local_4c = _h;
            local_48 = opt;
            free(top_blob->data);
            opt = local_48;
            _h_00 = local_54;
            _w = local_50;
            _h = local_4c;
          }
        }
        else {
          local_54 = _h_00;
          local_50 = _w;
          local_4c = _h;
          local_48 = opt;
          (**(code **)(*(long *)top_blob->allocator + 0x18))();
          opt = local_48;
          _h_00 = local_54;
          _w = local_50;
          _h = local_4c;
        }
      }
    }
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar14 = bottom_blob->w;
    iVar7 = bottom_blob->h;
    iVar8 = bottom_blob->c;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar14;
    top_blob->h = iVar7;
    top_blob->c = iVar8;
    top_blob->cstep = bottom_blob->cstep;
  }
  if (iVar9 == 3) {
    if (bVar15) {
      if (bVar11) {
        if (bVar12) {
          Mat::reshape(&local_98,bottom_blob,1,opt->blob_allocator);
          if (&local_98 != top_blob) {
            if (local_98.refcount != (int *)0x0) {
              LOCK();
              *local_98.refcount = *local_98.refcount + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (**(code **)(*(long *)top_blob->allocator + 0x18))();
                }
              }
            }
            top_blob->data = local_98.data;
            top_blob->refcount = local_98.refcount;
            top_blob->elemsize = local_98.elemsize;
            top_blob->elempack = local_98.elempack;
            top_blob->allocator = local_98.allocator;
            top_blob->dims = local_98.dims;
            top_blob->w = local_98.w;
            top_blob->h = local_98.h;
            top_blob->c = local_98.c;
            top_blob->cstep = local_98.cstep;
          }
          if (local_98.refcount == (int *)0x0) goto LAB_0015d0d9;
          LOCK();
          *local_98.refcount = *local_98.refcount + -1;
          UNLOCK();
          if (*local_98.refcount != 0) goto LAB_0015d0d9;
          if (local_98.allocator != (Allocator *)0x0) {
            (**(code **)(*(long *)local_98.allocator + 0x18))();
            goto LAB_0015d0d9;
          }
        }
        else {
          Mat::reshape(&local_98,bottom_blob,_h_00,opt->blob_allocator);
          if (&local_98 != top_blob) {
            if (local_98.refcount != (int *)0x0) {
              LOCK();
              *local_98.refcount = *local_98.refcount + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (**(code **)(*(long *)top_blob->allocator + 0x18))();
                }
              }
            }
            top_blob->data = local_98.data;
            top_blob->refcount = local_98.refcount;
            top_blob->elemsize = local_98.elemsize;
            top_blob->elempack = local_98.elempack;
            top_blob->allocator = local_98.allocator;
            top_blob->dims = local_98.dims;
            top_blob->w = local_98.w;
            top_blob->h = local_98.h;
            top_blob->c = local_98.c;
            top_blob->cstep = local_98.cstep;
          }
          if (local_98.refcount == (int *)0x0) goto LAB_0015d0d9;
          LOCK();
          *local_98.refcount = *local_98.refcount + -1;
          UNLOCK();
          if (*local_98.refcount != 0) goto LAB_0015d0d9;
          if (local_98.allocator != (Allocator *)0x0) {
            (**(code **)(*(long *)local_98.allocator + 0x18))();
            goto LAB_0015d0d9;
          }
        }
      }
      else if (bVar12) {
        Mat::reshape(&local_98,bottom_blob,_h,opt->blob_allocator);
        if (&local_98 != top_blob) {
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          top_blob->data = local_98.data;
          top_blob->refcount = local_98.refcount;
          top_blob->elemsize = local_98.elemsize;
          top_blob->elempack = local_98.elempack;
          top_blob->allocator = local_98.allocator;
          top_blob->dims = local_98.dims;
          top_blob->w = local_98.w;
          top_blob->h = local_98.h;
          top_blob->c = local_98.c;
          top_blob->cstep = local_98.cstep;
        }
        if (local_98.refcount == (int *)0x0) goto LAB_0015d0d9;
        LOCK();
        *local_98.refcount = *local_98.refcount + -1;
        UNLOCK();
        if (*local_98.refcount != 0) goto LAB_0015d0d9;
        if (local_98.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_98.allocator + 0x18))();
          goto LAB_0015d0d9;
        }
      }
      else {
        Mat::reshape(&local_98,bottom_blob,_h,_h_00,opt->blob_allocator);
        if (&local_98 != top_blob) {
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          top_blob->data = local_98.data;
          top_blob->refcount = local_98.refcount;
          top_blob->elemsize = local_98.elemsize;
          top_blob->elempack = local_98.elempack;
          top_blob->allocator = local_98.allocator;
          top_blob->dims = local_98.dims;
          top_blob->w = local_98.w;
          top_blob->h = local_98.h;
          top_blob->c = local_98.c;
          top_blob->cstep = local_98.cstep;
        }
        if (local_98.refcount == (int *)0x0) goto LAB_0015d0d9;
        LOCK();
        *local_98.refcount = *local_98.refcount + -1;
        UNLOCK();
        if (*local_98.refcount != 0) goto LAB_0015d0d9;
        if (local_98.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_98.allocator + 0x18))();
          goto LAB_0015d0d9;
        }
      }
    }
    else if (bVar11) {
      if (bVar12) {
        Mat::reshape(&local_98,bottom_blob,_w,opt->blob_allocator);
        if (&local_98 != top_blob) {
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          top_blob->data = local_98.data;
          top_blob->refcount = local_98.refcount;
          top_blob->elemsize = local_98.elemsize;
          top_blob->elempack = local_98.elempack;
          top_blob->allocator = local_98.allocator;
          top_blob->dims = local_98.dims;
          top_blob->w = local_98.w;
          top_blob->h = local_98.h;
          top_blob->c = local_98.c;
          top_blob->cstep = local_98.cstep;
        }
        if (local_98.refcount == (int *)0x0) goto LAB_0015d0d9;
        LOCK();
        *local_98.refcount = *local_98.refcount + -1;
        UNLOCK();
        if (*local_98.refcount != 0) goto LAB_0015d0d9;
        if (local_98.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_98.allocator + 0x18))();
          goto LAB_0015d0d9;
        }
      }
      else {
        Mat::reshape(&local_98,bottom_blob,_w,_h_00,opt->blob_allocator);
        if (&local_98 != top_blob) {
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          top_blob->data = local_98.data;
          top_blob->refcount = local_98.refcount;
          top_blob->elemsize = local_98.elemsize;
          top_blob->elempack = local_98.elempack;
          top_blob->allocator = local_98.allocator;
          top_blob->dims = local_98.dims;
          top_blob->w = local_98.w;
          top_blob->h = local_98.h;
          top_blob->c = local_98.c;
          top_blob->cstep = local_98.cstep;
        }
        if (local_98.refcount == (int *)0x0) goto LAB_0015d0d9;
        LOCK();
        *local_98.refcount = *local_98.refcount + -1;
        UNLOCK();
        if (*local_98.refcount != 0) goto LAB_0015d0d9;
        if (local_98.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_98.allocator + 0x18))();
          goto LAB_0015d0d9;
        }
      }
    }
    else {
      if (!bVar12) goto LAB_0015d0d9;
      Mat::reshape(&local_98,bottom_blob,_w,_h,opt->blob_allocator);
      if (&local_98 != top_blob) {
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        top_blob->data = local_98.data;
        top_blob->refcount = local_98.refcount;
        top_blob->elemsize = local_98.elemsize;
        top_blob->elempack = local_98.elempack;
        top_blob->allocator = local_98.allocator;
        top_blob->dims = local_98.dims;
        top_blob->w = local_98.w;
        top_blob->h = local_98.h;
        top_blob->c = local_98.c;
        top_blob->cstep = local_98.cstep;
      }
      if (local_98.refcount == (int *)0x0) goto LAB_0015d0d9;
      LOCK();
      *local_98.refcount = *local_98.refcount + -1;
      UNLOCK();
      if (*local_98.refcount != 0) goto LAB_0015d0d9;
      if (local_98.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
        goto LAB_0015d0d9;
      }
    }
  }
  else if (iVar9 == 2) {
    if (bVar15) {
      if (bVar11) {
        Mat::reshape(&local_98,bottom_blob,1,opt->blob_allocator);
        if (&local_98 != top_blob) {
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          top_blob->data = local_98.data;
          top_blob->refcount = local_98.refcount;
          top_blob->elemsize = local_98.elemsize;
          top_blob->elempack = local_98.elempack;
          top_blob->allocator = local_98.allocator;
          top_blob->dims = local_98.dims;
          top_blob->w = local_98.w;
          top_blob->h = local_98.h;
          top_blob->c = local_98.c;
          top_blob->cstep = local_98.cstep;
        }
        if (local_98.refcount == (int *)0x0) goto LAB_0015d0d9;
        LOCK();
        *local_98.refcount = *local_98.refcount + -1;
        UNLOCK();
        if (*local_98.refcount != 0) goto LAB_0015d0d9;
        if (local_98.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_98.allocator + 0x18))();
          goto LAB_0015d0d9;
        }
      }
      else {
        Mat::reshape(&local_98,bottom_blob,_h,opt->blob_allocator);
        if (&local_98 != top_blob) {
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          top_blob->data = local_98.data;
          top_blob->refcount = local_98.refcount;
          top_blob->elemsize = local_98.elemsize;
          top_blob->elempack = local_98.elempack;
          top_blob->allocator = local_98.allocator;
          top_blob->dims = local_98.dims;
          top_blob->w = local_98.w;
          top_blob->h = local_98.h;
          top_blob->c = local_98.c;
          top_blob->cstep = local_98.cstep;
        }
        if (local_98.refcount == (int *)0x0) goto LAB_0015d0d9;
        LOCK();
        *local_98.refcount = *local_98.refcount + -1;
        UNLOCK();
        if (*local_98.refcount != 0) goto LAB_0015d0d9;
        if (local_98.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_98.allocator + 0x18))();
          goto LAB_0015d0d9;
        }
      }
    }
    else {
      if (!bVar11) goto LAB_0015d0d9;
      Mat::reshape(&local_98,bottom_blob,_w,opt->blob_allocator);
      if (&local_98 != top_blob) {
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        top_blob->data = local_98.data;
        top_blob->refcount = local_98.refcount;
        top_blob->elemsize = local_98.elemsize;
        top_blob->elempack = local_98.elempack;
        top_blob->allocator = local_98.allocator;
        top_blob->dims = local_98.dims;
        top_blob->w = local_98.w;
        top_blob->h = local_98.h;
        top_blob->c = local_98.c;
        top_blob->cstep = local_98.cstep;
      }
      if (local_98.refcount == (int *)0x0) goto LAB_0015d0d9;
      LOCK();
      *local_98.refcount = *local_98.refcount + -1;
      UNLOCK();
      if (*local_98.refcount != 0) goto LAB_0015d0d9;
      if (local_98.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
        goto LAB_0015d0d9;
      }
    }
  }
  else {
    if ((iVar9 != 1) || (!bVar15)) goto LAB_0015d0d9;
    Mat::reshape(&local_98,bottom_blob,1,opt->blob_allocator);
    if (&local_98 != top_blob) {
      if (local_98.refcount != (int *)0x0) {
        LOCK();
        *local_98.refcount = *local_98.refcount + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      top_blob->data = local_98.data;
      top_blob->refcount = local_98.refcount;
      top_blob->elemsize = local_98.elemsize;
      top_blob->elempack = local_98.elempack;
      top_blob->allocator = local_98.allocator;
      top_blob->dims = local_98.dims;
      top_blob->w = local_98.w;
      top_blob->h = local_98.h;
      top_blob->c = local_98.c;
      top_blob->cstep = local_98.cstep;
    }
    if (local_98.refcount == (int *)0x0) goto LAB_0015d0d9;
    LOCK();
    *local_98.refcount = *local_98.refcount + -1;
    UNLOCK();
    if (*local_98.refcount != 0) goto LAB_0015d0d9;
    if (local_98.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_98.allocator + 0x18))();
      goto LAB_0015d0d9;
    }
  }
  if (local_98.data != (void *)0x0) {
    free(local_98.data);
  }
LAB_0015d0d9:
  if ((top_blob->data == (void *)0x0) || (iVar9 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar9 = -100;
  }
  return iVar9;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _squeeze_w = false;
    bool _squeeze_h = false;
    bool _squeeze_c = false;

    if (axes.empty())
    {
        _squeeze_w = w == 1 && squeeze_w;
        _squeeze_h = h == 1 && squeeze_h;
        _squeeze_c = channels == 1 && squeeze_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i=0; i<axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + 1 + axis;// +1 for N-dim

            if (dims == 1 && axis == 1)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 2 && axis == 1)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 2 && axis == 2)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 3 && axis == 1)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 3 && axis == 2)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 3 && axis == 3)
            {
                _squeeze_w = w == 1;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}